

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindEnumCodeFunction
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  reference pvVar5;
  type expr;
  pointer pEVar6;
  BinderException *this_00;
  InternalException *this_01;
  LogicalTypeId LVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                   (pvVar5);
  CheckEnumParameter(expr);
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  if (pEVar6[0x38] == (Expression)0x68) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    uVar4 = duckdb::EnumType::GetPhysicalType((LogicalType *)(pEVar6 + 0x38));
    switch(uVar4) {
    case 2:
      LVar7 = UTINYINT;
      break;
    default:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_58 = &uStack_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"Unsupported Enum Internal Type","");
      duckdb::InternalException::InternalException(this_01,(string *)&local_58);
      __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    case 4:
      LVar7 = USMALLINT;
      break;
    case 6:
      LVar7 = UINTEGER;
      break;
    case 8:
      LVar7 = UBIGINT;
    }
    duckdb::LogicalType::LogicalType((LogicalType *)&local_58,LVar7);
    uVar3 = uStack_48;
    uVar2 = local_50;
    bound_function->field_0x90 = local_58._0_1_;
    bound_function->field_0x91 = local_58._1_1_;
    uVar8 = *(undefined4 *)&bound_function->field_0x98;
    uVar10 = *(undefined4 *)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = 0;
    *(undefined8 *)&bound_function->field_0xa0 = 0;
    local_50 = 0;
    uStack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
    *(undefined8 *)&bound_function->field_0x98 = uVar2;
    *(undefined8 *)&bound_function->field_0xa0 = uVar3;
    uVar9 = *(undefined4 *)&bound_function->field_0x9c;
    uVar11 = *(undefined4 *)&bound_function->field_0xa4;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38 = uVar8;
      uStack_34 = *(undefined4 *)&bound_function->field_0x9c;
      uStack_30 = uVar10;
      uStack_2c = *(undefined4 *)&bound_function->field_0xa4;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      uVar8 = local_38;
      uVar9 = uStack_34;
      uVar10 = uStack_30;
      uVar11 = uStack_2c;
    }
    p_Var1 = uStack_48;
    local_50 = CONCAT44(uVar9,uVar8);
    uStack_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar11,uVar10);
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_58);
    *(undefined8 *)this = 0;
    return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
           (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_58 = &uStack_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"This function needs an ENUM as an argument","");
  duckdb::BinderException::BinderException(this_00,(string *)&local_58);
  __cxa_throw(this_00,&BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> BindEnumCodeFunction(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	CheckEnumParameter(*arguments[0]);
	if (arguments[0]->return_type.id() != LogicalTypeId::ENUM) {
		throw BinderException("This function needs an ENUM as an argument");
	}

	auto phy_type = EnumType::GetPhysicalType(arguments[0]->return_type);
	switch (phy_type) {
	case PhysicalType::UINT8:
		bound_function.return_type = LogicalType(LogicalTypeId::UTINYINT);
		break;
	case PhysicalType::UINT16:
		bound_function.return_type = LogicalType(LogicalTypeId::USMALLINT);
		break;
	case PhysicalType::UINT32:
		bound_function.return_type = LogicalType(LogicalTypeId::UINTEGER);
		break;
	case PhysicalType::UINT64:
		bound_function.return_type = LogicalType(LogicalTypeId::UBIGINT);
		break;
	default:
		throw InternalException("Unsupported Enum Internal Type");
	}

	return nullptr;
}